

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

void crnlib::image_utils::convert_image(image_u8 *img,conversion_type conv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  uint8 uVar6;
  ulong in_RAX;
  uint uVar7;
  uint y;
  uint uVar8;
  uint x_00;
  uint x;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  color_quad_u8 src;
  
  if ((uint)conv_type < 0xd) {
    switch(conv_type) {
    case cConversion_To_CCxY:
      img->m_comp_flags = 0x4b;
      break;
    case cConversion_From_CCxY:
      img->m_comp_flags = 7;
      break;
    case cConversion_To_xGxR:
      img->m_comp_flags = 0x2a;
      break;
    default:
      img->m_comp_flags = 0x27;
      break;
    case cConversion_To_xGBR:
      img->m_comp_flags = 0x2e;
      break;
    case cConversion_To_AGBR:
    case cConversion_From_AGBR:
      img->m_comp_flags = 0x2f;
      break;
    case cConversion_Y_To_A:
      *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 8;
      break;
    case cConversion_A_To_RGBA:
      img->m_comp_flags = 0xf;
      break;
    case cConversion_Y_To_RGB:
      img->m_comp_flags = img->m_comp_flags & 8 | 0x17;
      break;
    case cConversion_To_Y:
      *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 0x10;
    }
    _local_38 = in_RAX;
    for (uVar8 = 0; uVar8 < img->m_height; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar9 < img->m_width; uVar9 = uVar9 + 1) {
        pcVar5 = img->m_pPixels;
        uVar7 = img->m_pitch * uVar8 + uVar9;
        bVar1 = pcVar5[uVar7].field_0.field_0.r;
        bVar2 = pcVar5[uVar7].field_0.field_0.g;
        bVar3 = pcVar5[uVar7].field_0.field_0.b;
        bVar4 = pcVar5[uVar7].field_0.field_0.a;
        _local_38 = CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar2,CONCAT14(bVar1,_local_38))));
        if (0xc < (uint)conv_type) {
          uStack_37 = bVar2;
          local_38 = bVar1;
          uStack_36 = bVar3;
LAB_00117936:
          _local_38 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      CONCAT13(bVar4,_local_38);
          _local_38 = CONCAT44(0,_local_38);
          goto LAB_00117966;
        }
        x_00 = (uint)bVar1;
        uVar7 = (uint)bVar2;
        switch(conv_type) {
        case cConversion_To_CCxY:
          crnlib::color::RGB_to_YCC((color_quad_u8 *)&stack0xffffffffffffffc8,&src,0x7b,0x7d);
          break;
        case cConversion_From_CCxY:
          crnlib::color::YCC_to_RGB((color_quad_u8 *)&stack0xffffffffffffffc8,&src,0x7b,0x7d);
          break;
        case cConversion_To_xGxR:
          _local_38 = (uint3)bVar2 << 8;
          goto LAB_001178db;
        case cConversion_From_xGxR:
          x_00 = (uint)bVar4;
          goto LAB_00117958;
        case cConversion_To_xGBR:
          bVar4 = 0;
          goto LAB_0011788c;
        case cConversion_From_xGBR:
          uStack_37 = bVar2;
          local_38 = bVar4;
          uStack_36 = bVar3;
          goto LAB_00117961;
        default:
LAB_0011788c:
          uStack_37 = bVar2;
          local_38 = bVar4;
          uStack_36 = bVar3;
LAB_001178db:
          _local_38 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      CONCAT13(bVar1,_local_38);
          _local_38 = CONCAT44(0,_local_38);
          break;
        case cConversion_XY_to_XYZ:
          bVar4 = bVar1;
LAB_00117958:
          _local_38 = CONCAT62(_uStack_36,CONCAT11(bVar2,bVar4));
          uVar6 = regen_z(x_00,uVar7);
          uStack_36 = uVar6;
LAB_00117961:
          _local_38 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      CONCAT13(0xff,_local_38);
          _local_38 = CONCAT44(0,_local_38);
          break;
        case cConversion_Y_To_A:
          _local_38 = CONCAT11(bVar2,bVar1);
          _local_38 = CONCAT12(bVar3,_local_38);
          _local_38 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      CONCAT13((char)((uint)bVar3 * 0x1d2f + uVar7 * 0x9646 + x_00 * 0x4c8b + 0x8000
                                     >> 0x10),_local_38);
          _local_38 = CONCAT44(0,_local_38);
          break;
        case cConversion_A_To_RGBA:
          auVar10 = pshuflw(ZEXT216(CONCAT11(bVar4,bVar4)),ZEXT216(CONCAT11(bVar4,bVar4)),0);
          _local_38 = (ulong)auVar10._0_4_;
          break;
        case cConversion_Y_To_RGB:
        case cConversion_To_Y:
          uStack_37 = (undefined1)
                      ((uint)bVar3 * 0x1d2f + uVar7 * 0x9646 + x_00 * 0x4c8b + 0x8000 >> 0x10);
          local_38 = uStack_37;
          uStack_36 = uStack_37;
          goto LAB_00117936;
        }
LAB_00117966:
        pcVar5 = img->m_pPixels;
        uVar7 = img->m_pitch * uVar8 + uVar9;
        pcVar5[uVar7].field_0.field_0.r = local_38;
        pcVar5[uVar7].field_0.field_0.g = uStack_37;
        pcVar5[uVar7].field_0.field_0.b = uStack_36;
        pcVar5[uVar7].field_0.field_0.a = uStack_35;
      }
    }
  }
  return;
}

Assistant:

void convert_image(image_u8& img, image_utils::conversion_type conv_type)
        {
            switch (conv_type)
            {
            case image_utils::cConversion_To_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagLumaChroma));
                break;
            }
            case image_utils::cConversion_From_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid));
                break;
            }
            case image_utils::cConversion_To_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_XY_to_XYZ:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case cConversion_Y_To_A:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_A_To_RGBA:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_Y_To_RGB:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagGrayscale | (img.has_alpha() ? pixel_format_helpers::cCompFlagAValid : 0)));
                break;
            }
            case cConversion_To_Y:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagGrayscale));
                break;
            }
            default:
            {
                CRNLIB_ASSERT(false);
                return;
            }
            }

            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    color_quad_u8 src(img(x, y));
                    color_quad_u8 dst;

                    switch (conv_type)
                    {
                    case image_utils::cConversion_To_CCxY:
                    {
                        color::RGB_to_YCC(dst, src);
                        break;
                    }
                    case image_utils::cConversion_From_CCxY:
                    {
                        color::YCC_to_RGB(dst, src);
                        break;
                    }
                    case image_utils::cConversion_To_xGxR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = 0;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGxR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.a, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_To_xGBR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_To_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_From_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_XY_to_XYZ:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.r, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_Y_To_A:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = static_cast<uint8>(src.get_luma());
                        break;
                    }
                    case image_utils::cConversion_Y_To_RGB:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_A_To_RGBA:
                    {
                        dst.r = src.a;
                        dst.g = src.a;
                        dst.b = src.a;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_To_Y:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    default:
                    {
                        CRNLIB_ASSERT(false);
                        dst = src;
                        break;
                    }
                    }

                    img(x, y) = dst;
                }
            }
        }